

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Promise<void> __thiscall
capnp::Capability::Server::internalUnimplemented
          (Server *this,char *interfaceName,char *methodName,uint64_t typeId,uint16_t methodId)

{
  PromiseNode *extraout_RDX;
  undefined6 in_register_00000082;
  Promise<void> PVar1;
  unsigned_short *in_stack_fffffffffffffe50;
  uint16_t methodId_local;
  Array<char> local_1a0;
  uint64_t typeId_local;
  char *methodName_local;
  char *interfaceName_local;
  Exception local_170;
  
  typeId_local = CONCAT62(in_register_00000082,methodId);
  methodName_local = (char *)typeId;
  interfaceName_local = methodName;
  kj::_::Debug::
  makeDescription<char_const(&)[24],char_const*&,unsigned_long&,char_const*&,unsigned_short&>
            ((String *)&local_1a0,
             (Debug *)"\"Method not implemented.\", interfaceName, typeId, methodName, methodId",
             "Method not implemented.",(char (*) [24])&interfaceName_local,(char **)&typeId_local,
             (unsigned_long *)&methodName_local,(char **)&methodId_local,in_stack_fffffffffffffe50);
  kj::Exception::Exception
            (&local_170,UNIMPLEMENTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0x56,(String *)&local_1a0);
  kj::Promise<void>::Promise((Promise<void> *)this,&local_170);
  kj::Exception::~Exception(&local_170);
  kj::Array<char>::~Array(&local_1a0);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> Capability::Server::internalUnimplemented(
    const char* interfaceName, const char* methodName, uint64_t typeId, uint16_t methodId) {
  return KJ_EXCEPTION(UNIMPLEMENTED, "Method not implemented.", interfaceName,
                      typeId, methodName, methodId);
}